

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O0

int32_t uloc_getDisplayScript_63
                  (char *locale,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *pErrorCode)

{
  UErrorCode local_3c;
  int32_t res;
  UErrorCode err;
  UErrorCode *pErrorCode_local;
  UChar *pUStack_28;
  int32_t destCapacity_local;
  UChar *dest_local;
  char *displayLocale_local;
  char *locale_local;
  
  local_3c = U_ZERO_ERROR;
  _res = pErrorCode;
  pErrorCode_local._4_4_ = destCapacity;
  pUStack_28 = dest;
  dest_local = (UChar *)displayLocale;
  displayLocale_local = locale;
  locale_local._4_4_ =
       _getDisplayNameForComponent
                 (locale,displayLocale,dest,destCapacity,uloc_getScript_63,"Scripts%stand-alone",
                  &local_3c);
  if (local_3c == U_USING_DEFAULT_WARNING) {
    locale_local._4_4_ =
         _getDisplayNameForComponent
                   (displayLocale_local,(char *)dest_local,pUStack_28,pErrorCode_local._4_4_,
                    uloc_getScript_63,"Scripts",_res);
  }
  else {
    *_res = local_3c;
  }
  return locale_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayScript(const char* locale,
                      const char* displayLocale,
                      UChar *dest, int32_t destCapacity,
                      UErrorCode *pErrorCode)
{
	UErrorCode err = U_ZERO_ERROR;
	int32_t res = _getDisplayNameForComponent(locale, displayLocale, dest, destCapacity,
                uloc_getScript, _kScriptsStandAlone, &err);
	
	if ( err == U_USING_DEFAULT_WARNING ) {
        return _getDisplayNameForComponent(locale, displayLocale, dest, destCapacity,
                    uloc_getScript, _kScripts, pErrorCode);
	} else {
		*pErrorCode = err;
		return res;
	}
}